

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md32_common.h
# Opt level: O0

int SHA256_Update(SHA256_CTX *c,void *data_,size_t len)

{
  uint uVar1;
  uint *__s;
  ulong uVar2;
  size_t n;
  uint l;
  uchar *p;
  uchar *data;
  void *local_28;
  ulong local_20;
  
  if (len != 0) {
    uVar1 = c->Nl + (int)len * 8;
    if (uVar1 < c->Nl) {
      c->Nh = c->Nh + 1;
    }
    c->Nh = (int)(len >> 0x1d) + c->Nh;
    c->Nl = uVar1;
    uVar2 = (ulong)c->num;
    local_28 = data_;
    local_20 = len;
    if (uVar2 != 0) {
      __s = c->data;
      if ((len < 0x40) && (len + uVar2 < 0x40)) {
        memcpy((void *)((long)__s + uVar2),data_,len);
        c->num = (int)len + c->num;
        return 1;
      }
      memcpy((void *)((long)__s + uVar2),data_,0x40 - uVar2);
      sha256_block_data_order(c,__s,1);
      local_28 = (void *)((0x40 - uVar2) + (long)data_);
      local_20 = len - (0x40 - uVar2);
      c->num = 0;
      memset(__s,0,0x40);
    }
    uVar2 = local_20 >> 6;
    if (uVar2 != 0) {
      sha256_block_data_order(c,local_28,uVar2);
      local_28 = (void *)(uVar2 * 0x40 + (long)local_28);
      local_20 = local_20 + uVar2 * -0x40;
    }
    if (local_20 != 0) {
      c->num = (uint)local_20;
      memcpy(c->data,local_28,local_20);
    }
  }
  return 1;
}

Assistant:

int HASH_UPDATE(HASH_CTX *c, const void *data_, size_t len)
{
    const unsigned char *data = data_;
    unsigned char *p;
    HASH_LONG l;
    size_t n;

    if (len == 0)
        return 1;

    l = (c->Nl + (((HASH_LONG) len) << 3)) & 0xffffffffUL;
    if (l < c->Nl)              /* overflow */
        c->Nh++;
    c->Nh += (HASH_LONG) (len >> 29); /* might cause compiler warning on
                                       * 16-bit */
    c->Nl = l;

    n = c->num;
    if (n != 0) {
        p = (unsigned char *)c->data;

        if (len >= HASH_CBLOCK || len + n >= HASH_CBLOCK) {
            memcpy(p + n, data, HASH_CBLOCK - n);
            HASH_BLOCK_DATA_ORDER(c, p, 1);
            n = HASH_CBLOCK - n;
            data += n;
            len -= n;
            c->num = 0;
            /*
             * We use memset rather than OPENSSL_cleanse() here deliberately.
             * Using OPENSSL_cleanse() here could be a performance issue. It
             * will get properly cleansed on finalisation so this isn't a
             * security problem.
             */
            memset(p, 0, HASH_CBLOCK); /* keep it zeroed */
        } else {
            memcpy(p + n, data, len);
            c->num += (unsigned int)len;
            return 1;
        }
    }

    n = len / HASH_CBLOCK;
    if (n > 0) {
        HASH_BLOCK_DATA_ORDER(c, data, n);
        n *= HASH_CBLOCK;
        data += n;
        len -= n;
    }

    if (len != 0) {
        p = (unsigned char *)c->data;
        c->num = (unsigned int)len;
        memcpy(p, data, len);
    }
    return 1;
}